

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O0

int mbedtls_ecdsa_write_signature
              (mbedtls_ecdsa_context *ctx,mbedtls_md_type_t md_alg,uchar *hash,size_t hlen,
              uchar *sig,size_t *slen,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  undefined1 local_70 [8];
  mbedtls_mpi s;
  mbedtls_mpi r;
  int ret;
  size_t *slen_local;
  uchar *sig_local;
  size_t hlen_local;
  uchar *hash_local;
  mbedtls_md_type_t md_alg_local;
  mbedtls_ecdsa_context *ctx_local;
  
  mbedtls_mpi_init((mbedtls_mpi *)&s.p);
  mbedtls_mpi_init((mbedtls_mpi *)local_70);
  r.p._4_4_ = mbedtls_ecdsa_sign_det
                        (&ctx->grp,(mbedtls_mpi *)&s.p,(mbedtls_mpi *)local_70,&ctx->d,hash,hlen,
                         md_alg);
  if (r.p._4_4_ == 0) {
    r.p._4_4_ = ecdsa_signature_to_asn1((mbedtls_mpi *)&s.p,(mbedtls_mpi *)local_70,sig,slen);
  }
  mbedtls_mpi_free((mbedtls_mpi *)&s.p);
  mbedtls_mpi_free((mbedtls_mpi *)local_70);
  return r.p._4_4_;
}

Assistant:

int mbedtls_ecdsa_write_signature( mbedtls_ecdsa_context *ctx, mbedtls_md_type_t md_alg,
                           const unsigned char *hash, size_t hlen,
                           unsigned char *sig, size_t *slen,
                           int (*f_rng)(void *, unsigned char *, size_t),
                           void *p_rng )
{
    int ret;
    mbedtls_mpi r, s;

    mbedtls_mpi_init( &r );
    mbedtls_mpi_init( &s );

#if defined(MBEDTLS_ECDSA_DETERMINISTIC)
    (void) f_rng;
    (void) p_rng;

    MBEDTLS_MPI_CHK( mbedtls_ecdsa_sign_det( &ctx->grp, &r, &s, &ctx->d,
                             hash, hlen, md_alg ) );
#else
    (void) md_alg;

    MBEDTLS_MPI_CHK( mbedtls_ecdsa_sign( &ctx->grp, &r, &s, &ctx->d,
                         hash, hlen, f_rng, p_rng ) );
#endif

    MBEDTLS_MPI_CHK( ecdsa_signature_to_asn1( &r, &s, sig, slen ) );

cleanup:
    mbedtls_mpi_free( &r );
    mbedtls_mpi_free( &s );

    return( ret );
}